

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O3

bool __thiscall Nibbler::skipAll(Nibbler *this,char c)

{
  bool bVar1;
  size_type sVar2;
  
  if (this->_cursor < this->_length) {
    sVar2 = std::__cxx11::string::find_first_not_of((char)this,(ulong)(uint)(int)c);
    if (sVar2 == this->_cursor) {
      bVar1 = false;
    }
    else {
      if (sVar2 == 0xffffffffffffffff) {
        sVar2 = this->_length;
      }
      this->_cursor = sVar2;
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool Nibbler::skipAll (char c)
{
  if (_cursor < _length)
  {
    std::string::size_type i = _input.find_first_not_of (c, _cursor);
    if (i == _cursor)
      return false;

    if (i == std::string::npos)
      _cursor = _length;  // Yes, off the end.
    else
      _cursor = i;

    return true;
  }

  return false;
}